

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndTabBar(void)

{
  float fVar1;
  ImGuiWindow_conflict *pIVar2;
  ImGuiContext_conflict1 *pIVar3;
  ImGuiPtrOrIndex *pIVar4;
  ImGuiTabBar *pIVar5;
  uint uVar6;
  float fVar7;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    pIVar5 = GImGui->CurrentTabBar;
    if (pIVar5 == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar != __null) && \"Mismatched BeginTabBar()/EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1c69,"void ImGui::EndTabBar()");
    }
    if (pIVar5->WantLayout == true) {
      TabBarLayout(pIVar5);
    }
    if (((pIVar5->VisibleTabWasSubmitted == false) && (pIVar5->VisibleTabId != 0)) &&
       (pIVar3->FrameCount <= pIVar5->PrevFrameVisible + 1)) {
      (pIVar2->DC).CursorPos.y = (pIVar5->BarRect).Max.y + pIVar5->PrevTabsContentsHeight;
    }
    else {
      fVar1 = (pIVar5->BarRect).Max.y;
      fVar7 = (pIVar2->DC).CursorPos.y - fVar1;
      uVar6 = -(uint)(pIVar5->CurrTabsContentsHeight <= fVar7);
      fVar7 = (float)(~uVar6 & (uint)pIVar5->CurrTabsContentsHeight | (uint)fVar7 & uVar6);
      pIVar5->CurrTabsContentsHeight = fVar7;
      (pIVar2->DC).CursorPos.y = fVar7 + fVar1;
    }
    if ('\x01' < pIVar5->BeginCount) {
      (pIVar2->DC).CursorPos = pIVar5->BackupCursorPos;
    }
    if ((pIVar5->Flags & 0x100000) == 0) {
      PopID();
    }
    ImVector<ImGuiPtrOrIndex>::pop_back(&pIVar3->CurrentTabBarStack);
    if ((pIVar3->CurrentTabBarStack).Size == 0) {
      pIVar5 = (ImGuiTabBar *)0x0;
    }
    else {
      pIVar4 = ImVector<ImGuiPtrOrIndex>::back(&pIVar3->CurrentTabBarStack);
      pIVar5 = (ImGuiTabBar *)pIVar4->Ptr;
      if (pIVar5 == (ImGuiTabBar *)0x0) {
        pIVar5 = ImVector<ImGuiTabBar>::operator[](&(GImGui->TabBars).Buf,pIVar4->Index);
      }
    }
    pIVar3->CurrentTabBar = pIVar5;
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Mismatched BeginTabBar()/EndTabBar()!");
        return;
    }

    // Fallback in case no TabItem have been submitted
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
    {
        tab_bar->CurrTabsContentsHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, tab_bar->CurrTabsContentsHeight);
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->CurrTabsContentsHeight;
    }
    else
    {
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->PrevTabsContentsHeight;
    }
    if (tab_bar->BeginCount > 1)
        window->DC.CursorPos = tab_bar->BackupCursorPos;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();

    g.CurrentTabBarStack.pop_back();
    g.CurrentTabBar = g.CurrentTabBarStack.empty() ? NULL : GetTabBarFromTabBarRef(g.CurrentTabBarStack.back());
}